

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenUnionVerify_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,Type *union_type)

{
  undefined1 local_78 [8];
  anon_class_24_3_322ae421 union_enum_loop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  EnumDef *local_28;
  EnumDef *enum_def;
  Type *union_type_local;
  CSharpGenerator *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ret;
  
  enum_def = (EnumDef *)union_type;
  union_type_local = (Type *)this;
  this_local = (CSharpGenerator *)__return_storage_ptr__;
  if (union_type->enum_def == (EnumDef *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_csharp.cpp"
                  ,0x692,
                  "std::string flatbuffers::csharp::CSharpGenerator::GenUnionVerify(const Type &) const"
                 );
  }
  local_28 = union_type->enum_def;
  local_29 = 0;
  std::operator+(&local_50,"\n\nstatic public class ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::operator+(__return_storage_ptr__,&local_50,"Verify\n");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"{\n");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "  static public bool Verify(Google.FlatBuffers.Verifier verifier, byte typeId, uint tablePos)\n"
            );
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  {\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"    bool result = true;\n");
  union_enum_loop.ret =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
  local_78 = (undefined1  [8])__return_storage_ptr__;
  union_enum_loop.enum_def = (EnumDef *)this;
  GenUnionVerify::anon_class_24_3_322ae421::operator()((anon_class_24_3_322ae421 *)local_78);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  }\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionVerify(const Type &union_type) const {
    if (union_type.enum_def) {
      const auto &enum_def = *union_type.enum_def;

      auto ret = "\n\nstatic public class " + enum_def.name + "Verify\n";
      ret += "{\n";
      ret +=
          "  static public bool Verify(Google.FlatBuffers.Verifier verifier, "
          "byte typeId, uint tablePos)\n";
      ret += "  {\n";
      ret += "    bool result = true;\n";

      const auto union_enum_loop = [&]() {
        ret += "    switch((" + enum_def.name + ")typeId)\n";
        ret += "    {\n";

        for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
             ++it) {
          const auto &ev = **it;
          if (ev.IsZero()) { continue; }

          ret += "      case " + Name(enum_def) + "." + Name(ev) + ":\n";

          if (IsString(ev.union_type)) {
            ret += "       result = verifier.VerifyUnionString(tablePos);\n";
            ret += "        break;";
          } else if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
            if (!ev.union_type.struct_def->fixed) {
              auto type = GenTypeGet(ev.union_type);
              ret += "        result = " + type +
                     "Verify.Verify(verifier, tablePos);\n";
            } else {
              ret += "        result = verifier.VerifyUnionData(tablePos, " +
                     NumToString(InlineSize(ev.union_type)) + ", " +
                     NumToString(InlineAlignment(ev.union_type)) + ");\n";
              ;
            }
            ret += "        break;";
          } else {
            FLATBUFFERS_ASSERT(false);
          }
          ret += "\n";
        }

        ret += "      default: result = true;\n";
        ret += "        break;\n";
        ret += "    }\n";
        ret += "    return result;\n";
      };

      union_enum_loop();
      ret += "  }\n";
      ret += "}\n";
      ret += "\n";

      return ret;
    }
    FLATBUFFERS_ASSERT(0);
    return "";
  }